

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenuSloppyState::enter(QMenuSloppyState *this)

{
  QMenuPrivate *this_00;
  Data *pDVar1;
  Data *pDVar2;
  QObject *pQVar3;
  QObject *pQVar4;
  
  if ((this->field_0x6c & 8) != 0) {
    this_00 = *(QMenuPrivate **)&(this->m_menu->super_QWidget).field_0x8;
    pDVar1 = (this->m_sub_menu).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this->m_sub_menu).wp.value;
    }
    pDVar2 = (this_00->activeMenu).wp.d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this_00->activeMenu).wp.value;
    }
    if (pQVar3 == pQVar4) {
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = (this->m_sub_menu).wp.value;
      }
      QMenuPrivate::hideMenu(this_00,(QMenu *)pQVar3);
      reset(this);
    }
  }
  if (this->m_parent != (QMenuSloppyState *)0x0) {
    childEnter(this->m_parent);
    return;
  }
  return;
}

Assistant:

void QMenuSloppyState::enter()
{
    QMenuPrivate *menuPriv = QMenuPrivate::get(m_menu);

    if (m_discard_state_when_entering_parent && m_sub_menu == menuPriv->activeMenu) {
        menuPriv->hideMenu(m_sub_menu);
        reset();
    }
    if (m_parent)
        m_parent->childEnter();
}